

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::binding_api_update
          (LayoutBindingTestResult *__return_storage_ptr__,
          ShaderStorageBufferLayoutBindingCase *this)

{
  GLSLVersion GVar1;
  String local_38;
  ShaderStorageBufferLayoutBindingCase *local_18;
  ShaderStorageBufferLayoutBindingCase *this_local;
  
  local_18 = this;
  this_local = (ShaderStorageBufferLayoutBindingCase *)__return_storage_ptr__;
  GVar1 = LayoutBindingBaseCase::getGLSLVersion(&this->super_LayoutBindingBaseCase);
  if (GVar1 == GLSL_VERSION_310_ES) {
    std::__cxx11::string::string((string *)&local_38);
    LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    LayoutBindingBaseCase::binding_api_update
              (__return_storage_ptr__,&this->super_LayoutBindingBaseCase);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_api_update(void)
	{
		// only for GL
		if (getGLSLVersion() == glu::GLSL_VERSION_310_ES)
			return LayoutBindingTestResult(true, String(), true);

		return LayoutBindingBaseCase::binding_api_update();
	}